

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

int uv_timer_stop(uv_timer_t *handle)

{
  anon_union_24_2_508bea68_for_node *paVar1;
  uint *puVar2;
  anon_struct_16_2_d918446b_for_timer_heap *heap;
  uint uVar3;
  uv__queue *puVar4;
  uv_loop_t *puVar5;
  heap_node *child;
  heap_node *phVar6;
  long *plVar7;
  bool bVar8;
  heap_node *phVar9;
  int iVar10;
  uint uVar11;
  anon_struct_16_2_d918446b_for_timer_heap *paVar12;
  uint uVar13;
  
  if ((handle->flags & 4) == 0) {
    puVar4 = (handle->node).queue.next;
    ((handle->node).queue.prev)->next = puVar4;
    puVar4->prev = (uv__queue *)(handle->node).heap[1];
  }
  else {
    puVar5 = handle->loop;
    uVar3 = (puVar5->timer_heap).nelts;
    if (uVar3 != 0) {
      heap = &puVar5->timer_heap;
      paVar1 = &handle->node;
      paVar12 = heap;
      if (uVar3 != 1) {
        iVar10 = 0;
        uVar11 = 0;
        uVar13 = uVar3;
        do {
          uVar11 = (uVar13 & 1) + uVar11 * 2;
          iVar10 = iVar10 + -1;
          bVar8 = 3 < uVar13;
          uVar13 = uVar13 >> 1;
        } while (bVar8);
        do {
          paVar12 = (anon_struct_16_2_d918446b_for_timer_heap *)
                    ((ulong)(uVar11 * 8 & 8) + (long)paVar12->min);
          uVar11 = uVar11 >> 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0);
      }
      (puVar5->timer_heap).nelts = uVar3 - 1;
      child = (heap_node *)paVar12->min;
      paVar12->min = (void *)0x0;
      if (child == (heap_node *)paVar1) {
        if ((anon_union_24_2_508bea68_for_node *)heap->min == paVar1) {
          heap->min = (void *)0x0;
        }
      }
      else {
        phVar6 = (heap_node *)(handle->node).heap[0];
        child->left = phVar6;
        phVar9 = (heap_node *)(handle->node).heap[1];
        child->right = phVar9;
        child->parent = (heap_node *)(handle->node).heap[2];
        if (phVar6 != (heap_node *)0x0) {
          phVar6->parent = child;
          phVar9 = child->right;
        }
        if (phVar9 != (heap_node *)0x0) {
          phVar9->parent = child;
        }
        plVar7 = (long *)(handle->node).heap[2];
        paVar12 = heap;
        if (plVar7 != (long *)0x0) {
          paVar12 = (anon_struct_16_2_d918446b_for_timer_heap *)
                    (plVar7 + ((anon_union_24_2_508bea68_for_node *)*plVar7 != paVar1));
        }
        paVar12->min = child;
        while( true ) {
          phVar6 = child->left;
          phVar9 = child;
          if (phVar6 != (heap_node *)0x0) {
            if ((phVar6[1].left < child[1].left) ||
               ((phVar6[1].left <= child[1].left && (phVar6[1].parent < child[1].parent)))) {
              phVar9 = phVar6;
            }
          }
          phVar6 = child->right;
          if (phVar6 != (heap_node *)0x0) {
            if ((phVar6[1].left < phVar9[1].left) ||
               ((phVar6[1].left <= phVar9[1].left && (phVar6[1].parent < phVar9[1].parent)))) {
              phVar9 = phVar6;
            }
          }
          if (phVar9 == child) break;
          heap_node_swap((heap *)heap,child,phVar9);
        }
        while (phVar6 = child->parent, phVar6 != (heap_node *)0x0) {
          if ((phVar6[1].left <= child[1].left) &&
             ((phVar6[1].left < child[1].left || (phVar6[1].parent <= child[1].parent)))) break;
          heap_node_swap((heap *)heap,phVar6,child);
        }
      }
    }
    uVar3 = handle->flags;
    if (((uVar3 & 4) != 0) && (handle->flags = uVar3 & 0xfffffffb, (uVar3 & 8) != 0)) {
      puVar2 = &handle->loop->active_handles;
      *puVar2 = *puVar2 - 1;
    }
  }
  (handle->node).heap[0] = &handle->node;
  (handle->node).heap[1] = &handle->node;
  return 0;
}

Assistant:

int uv_timer_stop(uv_timer_t* handle) {
  if (uv__is_active(handle)) {
    heap_remove((struct heap*) &handle->loop->timer_heap,
                (struct heap_node*) &handle->node.heap,
                timer_less_than);
    uv__handle_stop(handle);
  } else {
    uv__queue_remove(&handle->node.queue);
  }

  uv__queue_init(&handle->node.queue);
  return 0;
}